

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall YAJLFrame::YAJLFrame(YAJLFrame *this,YAJLMiscData *misc,bitio_stream *bstream)

{
  bool bVar1;
  ssize_t sVar2;
  bitio_stream **in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  YAJLFrameHeader *local_68;
  YAJLFrameHeader local_60;
  uint16_t local_24;
  byte local_21;
  u16 marker;
  bitio_stream *pbStack_20;
  bool run;
  bitio_stream *bstream_local;
  YAJLMiscData *misc_local;
  YAJLFrame *this_local;
  
  pbStack_20 = bstream;
  bstream_local = (bitio_stream *)misc;
  misc_local = (YAJLMiscData *)this;
  YAJLTables::YAJLTables(&this->tables);
  YAJLFrameHeader::YAJLFrameHeader(&this->header);
  std::vector<YAJLScan,_std::allocator<YAJLScan>_>::vector(&this->scans);
  local_21 = 1;
  __buf = extraout_RDX;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              if ((local_21 & 1) == 0) {
                return;
              }
              sVar2 = bitio::bitio_stream::read(pbStack_20,0x10,__buf,(size_t)in_RCX);
              local_24 = (uint16_t)sVar2;
              bVar1 = markers::is_app_marker(local_24);
              if (!bVar1) break;
              YAJLMiscData::fetch_app_data((YAJLMiscData *)bstream_local,pbStack_20);
              __buf = extraout_RDX_00;
            }
            if (local_24 != 0xfffe) break;
            YAJLMiscData::fetch_comment((YAJLMiscData *)bstream_local,pbStack_20);
            __buf = extraout_RDX_01;
          }
          if (local_24 != 0xffdb) break;
          YAJLTables::fetch_qtable(&this->tables,pbStack_20);
          __buf = extraout_RDX_02;
        }
        if ((local_24 != 0xffc4) && (local_24 != 0xffcc)) break;
        YAJLTables::fetch_etable(&this->tables,local_24,pbStack_20);
        __buf = extraout_RDX_03;
      }
      if (local_24 != 0xffdc) break;
      bitio::bitio_stream::skip(pbStack_20,0x10);
      in_RCX = (bitio_stream **)bitio::bitio_stream::read(pbStack_20,0x10,__buf_00,(size_t)in_RCX);
      (this->header).nlines = (u16)in_RCX;
      __buf = extraout_RDX_04;
    }
    bVar1 = markers::is_sof_marker(local_24);
    if (!bVar1) break;
    YAJLFrameHeader::YAJLFrameHeader(&local_60,local_24,pbStack_20);
    YAJLFrameHeader::operator=(&this->header,&local_60);
    YAJLFrameHeader::~YAJLFrameHeader(&local_60);
    in_RCX = &stack0xffffffffffffffe0;
    local_68 = &this->header;
    std::vector<YAJLScan,std::allocator<YAJLScan>>::
    emplace_back<YAJLMiscData*&,YAJLFrameHeader*,bitio::bitio_stream*&>
              ((vector<YAJLScan,std::allocator<YAJLScan>> *)&this->scans,
               (YAJLMiscData **)&bstream_local,&local_68,in_RCX);
    printf("Run completed at: %s for \'Frame\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
          );
    local_21 = 0;
    __buf = extraout_RDX_05;
  }
  fprintf(_stderr,"Unhandled marker at: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
         );
  exit(1);
}

Assistant:

YAJLFrame::YAJLFrame(YAJLMiscData *misc, bitio::bitio_stream *bstream) {
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::DNL) {
            // skip the length parameter as we know that Nl is a u16.
            bstream->skip(0x10);
            header.nlines = bstream->read(0x10);
        } else if (markers::is_sof_marker(marker)) {
            header = YAJLFrameHeader(marker, bstream);
            // now we parse one Scan

            scans.emplace_back(misc, &header, bstream);
#ifdef DEBUG
            printf("Run completed at: %s for 'Frame'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}